

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

void __thiscall VmFunction::DetachBlock(VmFunction *this,VmBlock *block)

{
  VmBlock *pVVar1;
  VmBlock *pVVar2;
  
  if (block == (VmBlock *)0x0) {
    __assert_fail("block",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x837,"void VmFunction::DetachBlock(VmBlock *)");
  }
  if (block->parent == this) {
    if (this->firstBlock == block) {
      this->firstBlock = block->nextSibling;
    }
    pVVar1 = block->prevSibling;
    if (this->lastBlock == block) {
      this->lastBlock = pVVar1;
    }
    pVVar2 = block->nextSibling;
    if (pVVar1 != (VmBlock *)0x0) {
      pVVar1->nextSibling = pVVar2;
    }
    if (pVVar2 != (VmBlock *)0x0) {
      pVVar2->prevSibling = pVVar1;
    }
    block->parent = (VmFunction *)0x0;
    block->prevSibling = (VmBlock *)0x0;
    block->nextSibling = (VmBlock *)0x0;
    return;
  }
  __assert_fail("block->parent == this",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0x838,"void VmFunction::DetachBlock(VmBlock *)");
}

Assistant:

void VmFunction::DetachBlock(VmBlock *block)
{
	assert(block);
	assert(block->parent == this);

	if(block == firstBlock)
		firstBlock = block->nextSibling;

	if(block == lastBlock)
		lastBlock = block->prevSibling;

	if(block->prevSibling)
		block->prevSibling->nextSibling = block->nextSibling;
	if(block->nextSibling)
		block->nextSibling->prevSibling = block->prevSibling;

	block->parent = NULL;
	block->prevSibling = NULL;
	block->nextSibling = NULL;
}